

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

int WriteImage(WebPPicture *pic,VP8LBitWriter *bw,size_t *coded_size)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  long lVar6;
  ulong uVar7;
  uint8_t pad_byte [1];
  uint local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 uStack_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  
  puVar4 = VP8LBitWriterFinish(bw);
  puVar5 = bw->cur_;
  iVar3 = bw->used_;
  puVar2 = bw->buf_;
  *coded_size = 0;
  if (bw->error_ != 0) {
    iVar3 = WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
    return iVar3;
  }
  lVar6 = (long)(iVar3 + 7 >> 3);
  puVar1 = puVar5 + (lVar6 - (long)puVar2);
  puVar5 = puVar5 + (lVar6 - (long)puVar2) + 1;
  uVar7 = (ulong)((uint)puVar5 & 1);
  iStack_44 = (int)(puVar1 + uVar7) + 0xd;
  local_48 = 0x46464952;
  uStack_40 = 0x50424557;
  uStack_3c = 0x4c385056;
  uStack_34 = 0x2f;
  uStack_38 = SUB81(puVar5,0);
  uStack_37 = (undefined1)((ulong)puVar5 >> 8);
  uStack_36 = (undefined1)((ulong)puVar5 >> 0x10);
  uStack_35 = (undefined1)((ulong)puVar5 >> 0x18);
  iVar3 = (*pic->writer)((uint8_t *)&local_48,0x15,pic);
  if ((iVar3 != 0) && (iVar3 = (*pic->writer)(puVar4,(size_t)puVar1,pic), iVar3 != 0)) {
    if (uVar7 != 0) {
      local_48 = local_48 & 0xffffff00;
      iVar3 = (*pic->writer)((uint8_t *)&local_48,1,pic);
      if (iVar3 == 0) goto LAB_0013bde5;
    }
    *coded_size = (size_t)(puVar1 + uVar7 + 0x15);
    return 1;
  }
LAB_0013bde5:
  iVar3 = WebPEncodingSetError(pic,VP8_ENC_ERROR_BAD_WRITE);
  return iVar3;
}

Assistant:

static int WriteImage(const WebPPicture* const pic, VP8LBitWriter* const bw,
                      size_t* const coded_size) {
  const uint8_t* const webpll_data = VP8LBitWriterFinish(bw);
  const size_t webpll_size = VP8LBitWriterNumBytes(bw);
  const size_t vp8l_size = VP8L_SIGNATURE_SIZE + webpll_size;
  const size_t pad = vp8l_size & 1;
  const size_t riff_size = TAG_SIZE + CHUNK_HEADER_SIZE + vp8l_size + pad;
  *coded_size = 0;

  if (bw->error_) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  if (!WriteRiffHeader(pic, riff_size, vp8l_size) ||
      !pic->writer(webpll_data, webpll_size, pic)) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_WRITE);
  }

  if (pad) {
    const uint8_t pad_byte[1] = { 0 };
    if (!pic->writer(pad_byte, 1, pic)) {
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_WRITE);
    }
  }
  *coded_size = CHUNK_HEADER_SIZE + riff_size;
  return 1;
}